

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O0

void If_ObjConePrint_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Cut_t *pCut_00;
  uint local_38;
  If_Cut_t *pCut;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  
  pCut_00 = If_ObjCutBest(pIfObj);
  iVar1 = If_CutDataInt(pCut_00);
  if (iVar1 == 0) {
    Vec_PtrPush(vVisited,pCut_00);
    If_CutSetDataInt(pCut_00,-1);
    iVar1 = If_ObjIsCi(pIfObj);
    if (iVar1 == 0) {
      if (pIfObj->pEquiv != (If_Obj_t *)0x0) {
        If_ObjConePrint_rec(pIfMan,pIfObj->pEquiv,vVisited);
      }
      If_ObjConePrint_rec(pIfMan,pIfObj->pFanin0,vVisited);
      If_ObjConePrint_rec(pIfMan,pIfObj->pFanin1,vVisited);
      if (pIfObj->pEquiv == (If_Obj_t *)0x0) {
        local_38 = 0;
      }
      else {
        local_38 = pIfObj->pEquiv->Id;
      }
      printf("%5d = %5d & %5d | %5d\n",(ulong)(uint)pIfObj->Id,(ulong)(uint)pIfObj->pFanin0->Id,
             (ulong)(uint)pIfObj->pFanin1->Id,(ulong)local_38);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Prints the logic cone with choices.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_ObjConePrint_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    pCut = If_ObjCutBest(pIfObj);
    if ( If_CutDataInt(pCut) )
        return;
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return;
    // compute the functions of the children
    if ( pIfObj->pEquiv ) 
    If_ObjConePrint_rec( pIfMan, pIfObj->pEquiv, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin0, vVisited );
    If_ObjConePrint_rec( pIfMan, pIfObj->pFanin1, vVisited );
    printf( "%5d = %5d & %5d | %5d\n", pIfObj->Id, pIfObj->pFanin0->Id, pIfObj->pFanin1->Id, pIfObj->pEquiv ? pIfObj->pEquiv->Id : 0 );
}